

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec.h
# Opt level: O0

void __thiscall
Minisat::vec<Minisat::lbool,_int>::capacity(vec<Minisat::lbool,_int> *this,Size min_cap)

{
  Size SVar1;
  undefined8 uVar2;
  void *pvVar3;
  int in_ESI;
  undefined8 *in_RDI;
  Size size_max;
  Size add;
  size_t in_stack_ffffffffffffffd8;
  
  if (*(int *)((long)in_RDI + 0xc) < in_ESI) {
    SVar1 = max((in_ESI - *(int *)((long)in_RDI + 0xc)) + 1U & 0xfffffffe,
                (*(int *)((long)in_RDI + 0xc) >> 1) + 2U & 0xfffffffe);
    if (0x7fffffff - *(int *)((long)in_RDI + 0xc) < SVar1) {
      uVar2 = __cxa_allocate_exception(1);
      __cxa_throw(uVar2,&OutOfMemoryException::typeinfo,0);
    }
    *(Size *)((long)in_RDI + 0xc) = SVar1 + *(int *)((long)in_RDI + 0xc);
    pvVar3 = xrealloc(in_RDI,in_stack_ffffffffffffffd8);
    *in_RDI = pvVar3;
  }
  return;
}

Assistant:

void vec<T,_Size>::capacity(Size min_cap) {
    if (cap >= min_cap) return;
    Size add = max((min_cap - cap + 1) & ~1, ((cap >> 1) + 2) & ~1);   // NOTE: grow by approximately 3/2
    const Size size_max = std::numeric_limits<Size>::max();
    if ( ((size_max <= std::numeric_limits<int>::max()) && (add > size_max - cap)))
        throw OutOfMemoryException();

    data = (T*) xrealloc((void *)data, (cap += add) * sizeof(T));
 }